

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data-source-dos.cc
# Opt level: O1

void __thiscall DataSourceDOS::~DataSourceDOS(DataSourceDOS *this)

{
  pointer pDVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  
  (this->super_DataSourceLegacy).super_DataSourceBase.super_Source._vptr_Source =
       (_func_int **)&PTR_get_name_abi_cxx11__00156d88;
  pDVar1 = (this->entries).
           super__Vector_base<DataSourceDOS::DataEntry,_std::allocator<DataSourceDOS::DataEntry>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pDVar1 != (pointer)0x0) {
    operator_delete(pDVar1,(long)(this->entries).
                                 super__Vector_base<DataSourceDOS::DataEntry,_std::allocator<DataSourceDOS::DataEntry>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pDVar1);
  }
  this_00 = (this->spae).super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  DataSourceLegacy::~DataSourceLegacy(&this->super_DataSourceLegacy);
  return;
}

Assistant:

DataSourceDOS::~DataSourceDOS() {
}